

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O1

void __thiscall cppcms::http::content_type::content_type(content_type *this,char *begin,char *end)

{
  _Rb_tree_header *p_Var1;
  data *__p;
  
  __p = (data *)operator_new(0x90);
  memset(__p,0,0x90);
  (__p->type)._M_dataplus._M_p = (pointer)&(__p->type).field_2;
  (__p->type)._M_string_length = 0;
  (__p->type).field_2._M_local_buf[0] = '\0';
  (__p->subtype)._M_dataplus._M_p = (pointer)&(__p->subtype).field_2;
  (__p->subtype)._M_string_length = 0;
  (__p->subtype).field_2._M_local_buf[0] = '\0';
  (__p->media_type)._M_dataplus._M_p = (pointer)&(__p->media_type).field_2;
  (__p->media_type)._M_string_length = 0;
  (__p->media_type).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__p->parameters)._M_t._M_impl.super__Rb_tree_header;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__p->parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->d).super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cppcms::http::content_type::data*>
            (&(this->d).
              super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  parse(this,begin,end);
  return;
}

Assistant:

content_type::content_type(char const *begin,char const *end) :
		d(new content_type::data())
	{
		parse(begin,end);
	}